

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

GradleBuildConfigs * gradleBuildConfigs(GradleBuildConfigs *__return_storage_ptr__,QString *path)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  char *__s;
  char cVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  void *pvVar9;
  char *b;
  QChar QVar10;
  long lVar11;
  long in_FS_OFFSET;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArray local_e8;
  QArrayData *local_c8;
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  QByteArray local_a8;
  QArrayDataPointer<QByteArray> local_88;
  undefined1 *local_68;
  undefined1 *puStack_60;
  QArrayData *local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&__return_storage_ptr__->usesIntegerCompileSdkVersion = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->appNamespace).d.d = (Data *)0x0;
  (__return_storage_ptr__->appNamespace).d.ptr = (char16_t *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->appNamespace).d.ptr + 1) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->appNamespace).d.size + 1) = 0;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_68,(QString *)path);
  cVar4 = QFile::open((QFile *)&local_68,1);
  if (cVar4 != '\0') {
    local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    QIODevice::readAll();
    QByteArray::split((char)&local_88);
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,1,0x10);
      }
    }
    if ((undefined1 *)local_88.size != (undefined1 *)0x0) {
      lVar11 = local_88.size * 0x18;
      do {
        local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_a8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray::trimmed_helper(&local_a8);
        qVar3 = local_a8.d.size;
        __s = local_a8.d.ptr;
        QVar12.m_data = local_a8.d.ptr;
        QVar12.m_size = local_a8.d.size;
        QVar17.m_data = "//";
        QVar17.m_size = 2;
        cVar4 = QtPrivate::startsWith(QVar12,QVar17);
        if ((cVar4 == '\0') &&
           ((((undefined1 *)qVar3 == (undefined1 *)0x0 || (*__s != '*')) &&
            (QVar13.m_data = __s, QVar13.m_size = qVar3, QVar18.m_data = "/*", QVar18.m_size = 2,
            cVar4 = QtPrivate::startsWith(QVar13,QVar18), cVar4 == '\0')))) {
          QVar14.m_data = __s;
          QVar14.m_size = qVar3;
          QVar19.m_data = "compileSdkVersion androidCompileSdkVersion.toInteger()";
          QVar19.m_size = 0x36;
          lVar8 = QtPrivate::findByteArray(QVar14,0,QVar19);
          if (lVar8 == -1) {
            QVar15.m_data = __s;
            QVar15.m_size = qVar3;
            QVar20.m_data = "namespace";
            QVar20.m_size = 9;
            lVar8 = QtPrivate::findByteArray(QVar15,0,QVar20);
            if (lVar8 != -1) {
              local_b8 = &DAT_aaaaaaaaaaaaaaaa;
              local_c8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
              puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
              if ((undefined1 *)qVar3 == (undefined1 *)0x0) {
LAB_0010e9e6:
                iVar7 = -1;
              }
              else {
                pvVar9 = memchr(__s,0x3d,qVar3);
                iVar7 = (int)pvVar9 - (int)__s;
                if (iVar7 == -1 || pvVar9 == (void *)0x0) {
                  pvVar9 = memchr(__s,0x20,qVar3);
                  if (pvVar9 == (void *)0x0) goto LAB_0010e9e6;
                  iVar7 = (int)pvVar9 - (int)__s;
                }
              }
              if (iVar7 < 0) {
                local_e8.d.d = (Data *)0x0;
                local_e8.d.ptr = (char *)0x0;
                local_e8.d.size = 0;
              }
              else {
                QByteArray::mid((longlong)&local_58,(longlong)&local_a8);
                QByteArray::trimmed_helper(&local_e8);
                if (local_58 != (QArrayData *)0x0) {
                  LOCK();
                  (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_58,1,0x10);
                  }
                }
              }
              QVar16.m_data = (storage_type_conflict *)local_e8.d.size;
              QVar16.m_size = (qsizetype)&local_c8;
              QString::fromUtf8(QVar16);
              if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,1,0x10);
                }
              }
              QVar10.ucs = (char16_t)&local_c8;
              cVar4 = QString::startsWith(QVar10,0x27);
              if (cVar4 == '\0') {
                bVar5 = 0;
              }
              else {
                bVar5 = QString::endsWith(QVar10,0x27);
              }
              cVar4 = QString::startsWith(QVar10,0x22);
              if (cVar4 == '\0') {
                bVar6 = 0;
              }
              else {
                bVar6 = QString::endsWith(QVar10,0x22);
              }
              if ((bVar5 | bVar6) == 1) {
                QString::mid((longlong)&local_58,(longlong)&local_c8);
                pQVar1 = &((__return_storage_ptr__->appNamespace).d.d)->super_QArrayData;
                pcVar2 = (__return_storage_ptr__->appNamespace).d.ptr;
                (__return_storage_ptr__->appNamespace).d.d = (Data *)local_58;
                (__return_storage_ptr__->appNamespace).d.ptr = pcStack_50;
                qVar3 = (__return_storage_ptr__->appNamespace).d.size;
                (__return_storage_ptr__->appNamespace).d.size = local_48;
                local_58 = pQVar1;
                pcStack_50 = pcVar2;
                local_48 = qVar3;
                if (pQVar1 != (QArrayData *)0x0) {
                  LOCK();
                  (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
                       (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(pQVar1,2,0x10);
                  }
                }
              }
              else {
                QString::operator=(&__return_storage_ptr__->appNamespace,(QString *)&local_c8);
              }
              if (local_c8 != (QArrayData *)0x0) {
                LOCK();
                (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_c8,2,0x10);
                }
              }
            }
          }
          else {
            __return_storage_ptr__->usesIntegerCompileSdkVersion = true;
          }
        }
        if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,1,0x10);
          }
        }
        lVar11 = lVar11 + -0x18;
      } while (lVar11 != 0);
    }
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_88);
  }
  QFile::~QFile((QFile *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

GradleBuildConfigs gradleBuildConfigs(const QString &path)
{
    GradleBuildConfigs configs;

    QFile file(path);
    if (!file.open(QIODevice::ReadOnly))
        return configs;

    auto isComment = [](const QByteArray &trimmed) {
        return trimmed.startsWith("//") || trimmed.startsWith('*') || trimmed.startsWith("/*");
    };

    auto extractValue = [](const QByteArray &trimmed) {
        int idx = trimmed.indexOf('=');

        if (idx == -1)
            idx = trimmed.indexOf(' ');

        if (idx > -1)
            return trimmed.mid(idx + 1).trimmed();

        return QByteArray();
    };

    const auto lines = file.readAll().split('\n');
    for (const auto &line : lines) {
        const QByteArray trimmedLine = line.trimmed();
        if (isComment(trimmedLine))
            continue;
        if (trimmedLine.contains("compileSdkVersion androidCompileSdkVersion.toInteger()")) {
            configs.usesIntegerCompileSdkVersion = true;
        } else if (trimmedLine.contains("namespace")) {
            const QString value = QString::fromUtf8(extractValue(trimmedLine));
            const bool singleQuoted = value.startsWith(u'\'') && value.endsWith(u'\'');
            const bool doubleQuoted = value.startsWith(u'\"') && value.endsWith(u'\"');

            if (singleQuoted || doubleQuoted)
                configs.appNamespace = value.mid(1, value.length() - 2);
            else
                configs.appNamespace = value;
        }
    }

    return configs;
}